

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O2

StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> * __thiscall
draco::Decoder::DecodePointCloudFromBuffer
          (StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
           *__return_storage_ptr__,Decoder *this,DecoderBuffer *in_buffer)

{
  Mesh *this_00;
  string *this_01;
  Status _status;
  StatusOr<draco::EncodedGeometryType> _statusor69;
  allocator<char> local_99;
  undefined1 local_98 [40];
  string local_70 [32];
  undefined1 local_50 [40];
  EncodedGeometryType local_28;
  
  GetEncodedGeometryType((StatusOr<draco::EncodedGeometryType> *)local_50,in_buffer);
  if (local_50._0_4_ == OK) {
    if (local_28 == TRIANGULAR_MESH) {
      this_00 = (Mesh *)operator_new(0xd8);
      Mesh::Mesh(this_00);
      DecodeBufferToGeometry((Status *)local_98,this,in_buffer,this_00);
      if (local_98._0_4_ == OK) {
LAB_0011fa97:
        std::__cxx11::string::~string((string *)(local_98 + 8));
        (__return_storage_ptr__->status_).code_ = OK;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
        (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
        super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
        super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = &this_00->super_PointCloud;
        goto LAB_0011f985;
      }
      StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
      StatusOr(__return_storage_ptr__,(Status *)local_98);
    }
    else {
      if (local_28 != POINT_CLOUD) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_70,"Unsupported geometry type.",&local_99);
        local_98._0_4_ = DRACO_ERROR;
        std::__cxx11::string::string((string *)(local_98 + 8),local_70);
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr(__return_storage_ptr__,(Status *)local_98);
        std::__cxx11::string::~string((string *)(local_98 + 8));
        this_01 = local_70;
        goto LAB_0011f980;
      }
      this_00 = (Mesh *)operator_new(0xa8);
      PointCloud::PointCloud((PointCloud *)this_00);
      DecodeBufferToGeometry((Status *)local_98,this,in_buffer,(PointCloud *)this_00);
      if (local_98._0_4_ == OK) goto LAB_0011fa97;
      StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
      StatusOr(__return_storage_ptr__,(Status *)local_98);
    }
    std::__cxx11::string::~string((string *)(local_98 + 8));
    (*(this_00->super_PointCloud)._vptr_PointCloud[1])(this_00);
  }
  else {
    Status::Status((Status *)local_98,(Status *)local_50);
    StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::StatusOr
              (__return_storage_ptr__,(Status *)local_98);
    this_01 = (string *)(local_98 + 8);
LAB_0011f980:
    std::__cxx11::string::~string(this_01);
  }
LAB_0011f985:
  std::__cxx11::string::~string((string *)(local_50 + 8));
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<PointCloud>> Decoder::DecodePointCloudFromBuffer(
    DecoderBuffer *in_buffer) {
  DRACO_ASSIGN_OR_RETURN(EncodedGeometryType type,
                         GetEncodedGeometryType(in_buffer))
  if (type == POINT_CLOUD) {
#ifdef DRACO_POINT_CLOUD_COMPRESSION_SUPPORTED
    std::unique_ptr<PointCloud> point_cloud(new PointCloud());
    DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, point_cloud.get()))
    return std::move(point_cloud);
#endif
  } else if (type == TRIANGULAR_MESH) {
#ifdef DRACO_MESH_COMPRESSION_SUPPORTED
    std::unique_ptr<Mesh> mesh(new Mesh());
    DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, mesh.get()))
    return static_cast<std::unique_ptr<PointCloud>>(std::move(mesh));
#endif
  }
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
}